

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLSGetNumJTSetupEvals(void *arkode_mem,long *njtsetups)

{
  undefined8 *in_RSI;
  int retval;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ARKodeMem *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = arkLs_AccessLMem(in_RSI,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                             (ARKLsMem *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (local_4 == 0) {
    *in_RSI = in_stack_ffffffffffffffd8[0x17];
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkLSGetNumJTSetupEvals(void *arkode_mem, long int *njtsetups)
{
  ARKodeMem ark_mem;
  ARKLsMem  arkls_mem;
  int       retval;

  /* access ARKLsMem structure; set output value and return */
  retval = arkLs_AccessLMem(arkode_mem, "arkLSGetNumJTSetupEvals",
                            &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);
  *njtsetups = arkls_mem->njtsetup;
  return(ARKLS_SUCCESS);
}